

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

MessageType __thiscall cmake::ConvertMessageType(cmake *this,MessageType t)

{
  bool bVar1;
  MessageType MVar2;
  
  if (t < FATAL_ERROR) {
    bVar1 = GetDevWarningsAsErrors(this,(cmMakefile *)0x0);
    MVar2 = AUTHOR_ERROR;
    if (t != AUTHOR_WARNING || !bVar1) {
      MVar2 = AUTHOR_WARNING;
      if (bVar1) {
        MVar2 = t;
      }
      if (t != AUTHOR_ERROR) {
        MVar2 = t;
      }
    }
  }
  else {
    MVar2 = t;
    if (t - DEPRECATION_ERROR < 2) {
      bVar1 = GetDeprecatedWarningsAsErrors(this,(cmMakefile *)0x0);
      MVar2 = DEPRECATION_ERROR;
      if (t != DEPRECATION_WARNING || !bVar1) {
        MVar2 = DEPRECATION_WARNING;
        if (bVar1) {
          MVar2 = t;
        }
        if (t != DEPRECATION_ERROR) {
          MVar2 = t;
        }
      }
    }
  }
  return MVar2;
}

Assistant:

cmake::MessageType cmake::ConvertMessageType(cmake::MessageType t)
{
  bool warningsAsErrors;

  if (t == cmake::AUTHOR_WARNING || t == cmake::AUTHOR_ERROR)
    {
    warningsAsErrors = this->GetDevWarningsAsErrors();
    if (warningsAsErrors && t == cmake::AUTHOR_WARNING)
      {
      t = cmake::AUTHOR_ERROR;
      }
    else if (!warningsAsErrors && t == cmake::AUTHOR_ERROR)
      {
      t = cmake::AUTHOR_WARNING;
      }
    }
  else if (t == cmake::DEPRECATION_WARNING || t == cmake::DEPRECATION_ERROR)
    {
    warningsAsErrors = this->GetDeprecatedWarningsAsErrors();
    if (warningsAsErrors && t == cmake::DEPRECATION_WARNING)
      {
      t = cmake::DEPRECATION_ERROR;
      }
    else if (!warningsAsErrors && t == cmake::DEPRECATION_ERROR)
      {
      t = cmake::DEPRECATION_WARNING;
      }
    }

  return t;
}